

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

result<sockpp::stream_socket> * __thiscall
sockpp::stream_socket::create
          (result<sockpp::stream_socket> *__return_storage_ptr__,stream_socket *this,int domain,
          int protocol)

{
  int __type;
  socket *psVar1;
  result<int> res;
  result<int> local_38;
  socket local_20;
  
  create_handle(&local_38,(int)this,domain);
  if (local_38.err_._M_value == 0) {
    local_20.handle_ = local_38.val_;
    local_20._vptr_socket = (_func_int **)&PTR__socket_0010dc58;
    psVar1 = &local_20;
    result<sockpp::stream_socket>::result(__return_storage_ptr__,(stream_socket *)&local_20);
    socket::~socket(&local_20,(int)psVar1,__type,protocol);
  }
  else {
    (__return_storage_ptr__->val_).super_socket.handle_ = -1;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010dc58;
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(local_38.err_._4_4_,local_38.err_._M_value);
    (__return_storage_ptr__->err_)._M_cat = local_38.err_._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

result<stream_socket> stream_socket::create(int domain, int protocol /*=0*/) {
    if (auto res = create_handle(domain, protocol); !res)
        return res.error();
    else
        return stream_socket{res.value()};
}